

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

void __thiscall pbrt::syntactic::Material::Material(Material *this,string *type)

{
  string *in_RSI;
  long in_RDI;
  
  ParamSet::ParamSet((ParamSet *)0x1c9c0d);
  std::shared_ptr<pbrt::syntactic::Attributes>::shared_ptr
            ((shared_ptr<pbrt::syntactic::Attributes> *)0x1c9c20);
  std::__cxx11::string::string((string *)(in_RDI + 0x40),in_RSI);
  std::__cxx11::string::string((string *)(in_RDI + 0x60));
  return;
}

Assistant:

Material(const std::string &type) : type(type) {}